

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O3

SQRESULT sqstd_createfile(HSQUIRRELVM v,SQFILE file,SQBool own)

{
  undefined8 uVar1;
  long lVar2;
  
  uVar1 = sq_gettop();
  sq_pushregistrytable(v);
  sq_pushstring(v,"std_file",0xffffffffffffffff);
  lVar2 = sq_get(v,0xfffffffffffffffe);
  if (-1 < lVar2) {
    sq_remove(v,0xfffffffffffffffe);
    sq_pushroottable(v);
    sq_pushuserpointer(v,file);
    if (own == 0) {
      sq_pushnull(v);
    }
    else {
      sq_pushinteger(v,1);
    }
    lVar2 = sq_call(v,3,1,0);
    if (-1 < lVar2) {
      sq_remove(v,0xfffffffffffffffe);
      return 0;
    }
  }
  sq_settop(v,uVar1);
  return -1;
}

Assistant:

SQRESULT sqstd_createfile(HSQUIRRELVM v, SQFILE file,SQBool own)
{
    SQInteger top = sq_gettop(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_file"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-2))) {
        sq_remove(v,-2); //removes the registry
        sq_pushroottable(v); // push the this
        sq_pushuserpointer(v,file); //file
        if(own){
            sq_pushinteger(v,1); //true
        }
        else{
            sq_pushnull(v); //false
        }
        if(SQ_SUCCEEDED( sq_call(v,3,SQTrue,SQFalse) )) {
            sq_remove(v,-2);
            return SQ_OK;
        }
    }
    sq_settop(v,top);
    return SQ_ERROR;
}